

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open.c
# Opt level: O3

FILE * open_file_std(char *fname,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 *puVar3;
  FILE *pFVar4;
  char *pcVar5;
  FILE *extraout_RAX;
  long lVar6;
  uint n;
  long lVar7;
  int iVar8;
  
  if ((*fname != '-') || (fname[1] != '\0')) {
    pFVar2 = fopen(fname,mode);
    return (FILE *)pFVar2;
  }
  if (*mode == 'w') {
    puVar3 = (undefined8 *)&stdout;
  }
  else {
    if (*mode != 'r') {
      pcVar5 = mode;
      open_file_std_cold_1();
      iVar8 = (int)pcVar5;
      if ((0 < iVar8) && (n = (uint)mode, 0 < (int)n)) {
        pFVar4 = (FILE *)chk_alloc(1,0x20);
        pFVar4->_flags = iVar8;
        *(uint *)&pFVar4->field_0x4 = n;
        *(uint *)&pFVar4->_IO_read_ptr = iVar8 + 0x1fU >> 5;
        pcVar5 = (char *)chk_alloc(n,8);
        pFVar4->_IO_read_end = pcVar5;
        pcVar5 = (char *)chk_alloc(*(int *)&pFVar4->field_0x4 * *(int *)&pFVar4->_IO_read_ptr,4);
        pFVar4->_IO_read_base = pcVar5;
        iVar8 = *(int *)&pFVar4->field_0x4;
        if (0 < (long)iVar8) {
          iVar1 = *(int *)&pFVar4->_IO_read_ptr;
          lVar6 = 0;
          lVar7 = 0;
          do {
            *(char **)(pFVar4->_IO_read_end + lVar7 * 8) = pFVar4->_IO_read_base + lVar6;
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + (long)iVar1 * 4;
          } while (iVar8 != lVar7);
        }
        return pFVar4;
      }
      mod2dense_allocate_cold_1();
      free(*(void **)(pcVar5 + 0x18));
      free(*(void **)(pcVar5 + 0x10));
      free(pcVar5);
      return extraout_RAX;
    }
    puVar3 = (undefined8 *)&stdin;
  }
  return (FILE *)*puVar3;
}

Assistant:

FILE *open_file_std
( char *fname,	/* Name of file to open, or "-" for stdin/stdout */
  char *mode	/* Mode for opening: eg, "r" or "w" */
)
{ 
  if (strcmp(fname,"-")==0)
  { switch (mode[0])
    { case 'r': 
      { return stdin;
      }
      case 'w': 
      { return stdout;
      }
      default:  
      { fprintf(stderr,"Bad mode passed to open_file_std: %s\n",mode);
        exit(1);
      }
    }
  }
  else
  { return fopen(fname,mode);
  }
}